

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

void Bmc_CexTest(Gia_Man_t *p,Abc_Cex_t *pCex,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Abc_Cex_t *local_50;
  Abc_Cex_t *pCexMin;
  Abc_Cex_t *pCexEss;
  Abc_Cex_t *pCexCare;
  Abc_Cex_t *pCexStates;
  Abc_Cex_t *pCexImpl;
  abctime clk;
  Abc_Cex_t *pAStack_18;
  int fVerbose_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  clk._4_4_ = fVerbose;
  pAStack_18 = pCex;
  pCex_local = (Abc_Cex_t *)p;
  pCexImpl = (Abc_Cex_t *)Abc_Clock();
  pCexStates = (Abc_Cex_t *)0x0;
  pCexCare = Bmc_CexInnerStates((Gia_Man_t *)pCex_local,pAStack_18,&pCexStates,clk._4_4_);
  pCexEss = Bmc_CexCareBits((Gia_Man_t *)pCex_local,pCexCare,pCexStates,(Abc_Cex_t *)0x0,1,clk._4_4_
                           );
  iVar1 = Bmc_CexVerify((Gia_Man_t *)pCex_local,pAStack_18,pCexEss);
  if (iVar1 == 0) {
    printf("Counter-example care-set verification has failed.\n");
  }
  pCexMin = Bmc_CexEssentialBits((Gia_Man_t *)pCex_local,pCexCare,pCexEss,clk._4_4_);
  local_50 = Bmc_CexCareBits((Gia_Man_t *)pCex_local,pCexCare,pCexStates,pCexMin,0,clk._4_4_);
  iVar1 = Bmc_CexVerify((Gia_Man_t *)pCex_local,pAStack_18,local_50);
  if (iVar1 == 0) {
    printf("Counter-example min-set verification has failed.\n");
  }
  Abc_CexFreeP(&pCexCare);
  Abc_CexFreeP(&pCexStates);
  Abc_CexFreeP(&pCexEss);
  Abc_CexFreeP(&pCexMin);
  Abc_CexFreeP(&local_50);
  aVar2 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar2 - (long)pCexImpl);
  return;
}

Assistant:

void Bmc_CexTest( Gia_Man_t * p, Abc_Cex_t * pCex, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Cex_t * pCexImpl   = NULL;
    Abc_Cex_t * pCexStates = Bmc_CexInnerStates( p, pCex, &pCexImpl, fVerbose );
    Abc_Cex_t * pCexCare   = Bmc_CexCareBits( p, pCexStates, pCexImpl, NULL, 1, fVerbose );
    Abc_Cex_t * pCexEss, * pCexMin;

    if ( !Bmc_CexVerify( p, pCex, pCexCare ) )
        printf( "Counter-example care-set verification has failed.\n" );

    pCexEss = Bmc_CexEssentialBits( p, pCexStates, pCexCare, fVerbose );
    pCexMin = Bmc_CexCareBits( p, pCexStates, pCexImpl, pCexEss, 0, fVerbose );

    if ( !Bmc_CexVerify( p, pCex, pCexMin ) )
        printf( "Counter-example min-set verification has failed.\n" );

//    Bmc_CexDumpStats( p, pCex, pCexCare, pCexEss, pCexMin, Abc_Clock() - clk );

    Abc_CexFreeP( &pCexStates );
    Abc_CexFreeP( &pCexImpl );
    Abc_CexFreeP( &pCexCare );
    Abc_CexFreeP( &pCexEss );
    Abc_CexFreeP( &pCexMin );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Bmc_CexBuildNetworkTest( p, pCex );
//    Bmc_CexPerformUnrollingTest( p, pCex );
}